

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  byte bVar1;
  short sVar2;
  uchar *puVar3;
  ushort uVar4;
  stbtt_vertex *__ptr;
  stbtt_vertex *__ptr_00;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  stbtt_vertex *psVar10;
  ushort *puVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  short sVar15;
  int cy;
  long lVar16;
  byte bVar17;
  byte bVar18;
  ulong uVar19;
  ushort uVar20;
  short sVar21;
  uint uVar22;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int cx;
  stbtt_vertex *local_88;
  stbtt_vertex *comp_verts;
  stbtt_fontinfo *local_78;
  undefined8 local_70;
  ulong local_68;
  ulong local_60;
  ushort *local_58;
  uint local_4c;
  ulong local_48;
  undefined8 local_40;
  stbtt_vertex *local_38;
  ulong uVar23;
  
  puVar3 = info->data;
  uVar5 = stbtt__GetGlyfOffset(info,glyph_index);
  *pvertices = (stbtt_vertex *)0x0;
  iVar8 = 0;
  if (-1 < (int)uVar5) {
    uVar9 = (ulong)uVar5;
    uVar4 = CONCAT11(puVar3[uVar9],puVar3[uVar9 + 1]);
    if ((short)uVar4 < 1) {
      if (uVar4 == 0xffff) {
        uVar12 = 0;
        psVar10 = (stbtt_vertex *)0x0;
        puVar11 = (ushort *)(puVar3 + uVar9 + 10);
        local_78 = info;
        for (uVar5 = 1; iVar8 = (int)uVar12, uVar5 != 0; uVar5 = uVar5 & 0x20) {
          local_88 = (stbtt_vertex *)0x0;
          bVar18 = *(byte *)((long)puVar11 + 1);
          uVar5 = (uint)bVar18;
          if ((bVar18 & 2) == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                          ,0x58d,
                          "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
          }
          if ((bVar18 & 1) == 0) {
            iVar6 = (int)(char)puVar11[2];
            iVar7 = (int)*(char *)((long)puVar11 + 5);
            lVar14 = 6;
          }
          else {
            iVar6 = (int)CONCAT11((char)puVar11[2],*(undefined1 *)((long)puVar11 + 5));
            iVar7 = (int)(short)(puVar11[3] << 8 | puVar11[3] >> 8);
            lVar14 = 8;
          }
          local_58 = (ushort *)(lVar14 + (long)puVar11);
          local_68 = CONCAT44(local_68._4_4_,(float)iVar6);
          comp_verts = (stbtt_vertex *)CONCAT44(comp_verts._4_4_,(float)iVar7);
          if ((bVar18 & 8) == 0) {
            if ((bVar18 & 0x40) == 0) {
              if ((char)bVar18 < '\0') {
                local_60 = CONCAT44(local_60._4_4_,
                                    (float)(int)(short)(*local_58 << 8 | *local_58 >> 8) *
                                    6.1035156e-05);
                local_40 = CONCAT44(local_40._4_4_,
                                    (float)(int)(short)(local_58[1] << 8 | local_58[1] >> 8) *
                                    6.1035156e-05);
                local_70 = CONCAT44(local_70._4_4_,
                                    (float)(int)(short)(local_58[2] << 8 | local_58[2] >> 8) *
                                    6.1035156e-05);
                local_48 = CONCAT44(local_48._4_4_,
                                    (float)(int)(short)(local_58[3] << 8 | local_58[3] >> 8) *
                                    6.1035156e-05);
                local_58 = local_58 + 4;
              }
              else {
                local_70 = (ulong)local_70._4_4_ << 0x20;
                local_48 = CONCAT44(local_48._4_4_,0x3f800000);
                local_40 = (ulong)local_40._4_4_ << 0x20;
                local_60 = CONCAT44(local_60._4_4_,0x3f800000);
              }
            }
            else {
              local_60 = CONCAT44(local_60._4_4_,
                                  (float)(int)(short)(*local_58 << 8 | *local_58 >> 8) *
                                  6.1035156e-05);
              local_48 = CONCAT44(local_48._4_4_,
                                  (float)(int)(short)(local_58[1] << 8 | local_58[1] >> 8) *
                                  6.1035156e-05);
              local_58 = local_58 + 2;
              local_70 = (ulong)local_70._4_4_ << 0x20;
              local_40 = (ulong)local_40._4_4_ << 0x20;
            }
          }
          else {
            fVar24 = (float)(int)(short)(*local_58 << 8 | *local_58 >> 8) * 6.1035156e-05;
            local_58 = local_58 + 1;
            local_70 = (ulong)local_70._4_4_ << 0x20;
            local_40 = (ulong)local_40._4_4_ << 0x20;
            local_48 = CONCAT44(local_48._4_4_,fVar24);
            local_60 = CONCAT44(local_60._4_4_,fVar24);
          }
          local_38 = psVar10;
          uVar22 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar11[1] << 8 | puVar11[1] >> 8),
                                       &local_88);
          __ptr = local_88;
          psVar10 = local_38;
          if (0 < (int)uVar22) {
            local_4c = (uint)bVar18;
            fVar24 = SQRT((float)local_60 * (float)local_60 + (float)local_40 * (float)local_40);
            fVar25 = SQRT((float)local_70 * (float)local_70 + (float)local_48 * (float)local_48);
            for (lVar14 = 0; (ulong)uVar22 * 10 - lVar14 != 0; lVar14 = lVar14 + 10) {
              fVar26 = (float)(int)*(short *)((long)&local_88->x + lVar14);
              fVar27 = (float)(int)*(short *)((long)&local_88->y + lVar14);
              *(short *)((long)&local_88->x + lVar14) =
                   (short)(int)(((float)local_60 * fVar26 + (float)local_70 * fVar27 +
                                (float)local_68) * fVar24);
              *(short *)((long)&local_88->y + lVar14) =
                   (short)(int)((fVar26 * (float)local_40 + fVar27 * (float)local_48 +
                                comp_verts._0_4_) * fVar25);
              fVar26 = (float)(int)*(short *)((long)&local_88->cx + lVar14);
              fVar27 = (float)(int)*(short *)((long)&local_88->cy + lVar14);
              *(short *)((long)&local_88->cx + lVar14) =
                   (short)(int)(((float)local_60 * fVar26 + (float)local_70 * fVar27 +
                                (float)local_68) * fVar24);
              *(short *)((long)&local_88->cy + lVar14) =
                   (short)(int)((fVar26 * (float)local_40 + fVar27 * (float)local_48 +
                                comp_verts._0_4_) * fVar25);
            }
            psVar10 = (stbtt_vertex *)malloc((ulong)(uVar22 + iVar8) * 10);
            __ptr_00 = local_38;
            if (psVar10 == (stbtt_vertex *)0x0) {
              free(local_38);
              free(__ptr);
              return 0;
            }
            if (0 < iVar8) {
              local_68 = uVar12;
              memcpy(psVar10,local_38,uVar12 * 10);
              uVar12 = local_68;
            }
            memcpy(psVar10 + uVar12,__ptr,(ulong)uVar22 * 10);
            free(__ptr_00);
            free(__ptr);
            uVar12 = (ulong)(uVar22 + iVar8);
            info = local_78;
            uVar5 = local_4c;
          }
          puVar11 = local_58;
        }
      }
      else {
        if ((short)((ushort)puVar3[uVar9] << 8) < 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                        ,0x5c2,
                        "int stbtt_GetGlyphShape(const stbtt_fontinfo *, int, stbtt_vertex **)");
        }
        iVar8 = 0;
        psVar10 = (stbtt_vertex *)0x0;
      }
    }
    else {
      uVar12 = (ulong)((uint)uVar4 * 2);
      bVar18 = puVar3[uVar12 + uVar9 + 10];
      local_38 = (stbtt_vertex *)(ulong)puVar3[uVar12 + uVar9 + 0xb];
      bVar17 = puVar3[uVar12 + uVar9 + 8];
      bVar1 = puVar3[uVar12 + uVar9 + 9];
      uVar5 = (uint)bVar17 * 0x100 + (uint)bVar1;
      comp_verts = (stbtt_vertex *)(ulong)uVar5;
      psVar10 = (stbtt_vertex *)malloc((ulong)((uVar5 + (uint)uVar4 * 2) * 10 + 10));
      if (psVar10 == (stbtt_vertex *)0x0) {
        return 0;
      }
      local_78 = (stbtt_fontinfo *)(puVar3 + uVar9 + 10);
      puVar11 = (ushort *)(puVar3 + (ulong)bVar18 * 0x100 + (long)local_38 + uVar12 + uVar9 + 0xc);
      uVar9 = uVar12 & 0xffff;
      lVar14 = (ulong)(CONCAT11(bVar17,bVar1) + 1) * 10;
      bVar17 = 0;
      bVar18 = 0;
      for (lVar16 = 0; lVar14 - lVar16 != 0; lVar16 = lVar16 + 10) {
        if (bVar17 == 0) {
          bVar18 = (byte)*puVar11;
          if ((bVar18 & 8) == 0) {
            puVar11 = (ushort *)((long)puVar11 + 1);
            bVar17 = 0;
          }
          else {
            bVar17 = *(byte *)((long)puVar11 + 1);
            puVar11 = puVar11 + 1;
          }
        }
        else {
          bVar17 = bVar17 - 1;
        }
        (&psVar10[uVar9].type)[lVar16] = bVar18;
      }
      sVar21 = 0;
      for (lVar16 = 0; lVar14 - lVar16 != 0; lVar16 = lVar16 + 10) {
        bVar18 = (&psVar10[uVar9].type)[lVar16];
        if ((bVar18 & 2) == 0) {
          if ((bVar18 & 0x10) == 0) {
            sVar21 = sVar21 + (*puVar11 << 8 | *puVar11 >> 8);
            puVar11 = puVar11 + 1;
          }
        }
        else {
          uVar4 = *puVar11;
          puVar11 = (ushort *)((long)puVar11 + 1);
          uVar20 = -(ushort)(byte)uVar4;
          if ((bVar18 & 0x10) != 0) {
            uVar20 = (ushort)(byte)uVar4;
          }
          sVar21 = sVar21 + uVar20;
        }
        *(short *)((long)&psVar10[uVar9].x + lVar16) = sVar21;
      }
      sVar21 = 0;
      for (lVar16 = 0; lVar14 - lVar16 != 0; lVar16 = lVar16 + 10) {
        bVar18 = (&psVar10[uVar9].type)[lVar16];
        if ((bVar18 & 4) == 0) {
          if ((bVar18 & 0x20) == 0) {
            sVar21 = sVar21 + (*puVar11 << 8 | *puVar11 >> 8);
            puVar11 = puVar11 + 1;
          }
        }
        else {
          uVar4 = *puVar11;
          puVar11 = (ushort *)((long)puVar11 + 1);
          uVar20 = -(ushort)(byte)uVar4;
          if ((bVar18 & 0x20) != 0) {
            uVar20 = (ushort)(byte)uVar4;
          }
          sVar21 = sVar21 + uVar20;
        }
        *(short *)((long)&psVar10[uVar9].y + lVar16) = sVar21;
      }
      iVar8 = 0;
      local_4c = 0;
      local_48 = 0;
      local_40 = 0;
      uVar9 = 0;
      uVar19 = 0;
      local_58 = (ushort *)0x0;
      local_68 = 0;
      iVar13 = 0;
      local_70 = 0;
      iVar7 = 0;
      iVar6 = 0;
      local_60 = uVar12;
      local_38 = psVar10;
      while( true ) {
        cy = (int)local_40;
        cx = (int)local_48;
        if ((int)comp_verts._0_4_ < iVar7) break;
        lVar14 = (long)(iVar7 + (int)local_60);
        bVar18 = local_38[lVar14].type;
        sVar21 = local_38[lVar14].x;
        sVar2 = local_38[lVar14].y;
        uVar5 = (uint)sVar21;
        uVar12 = (ulong)uVar5;
        uVar22 = (uint)sVar2;
        uVar23 = (ulong)uVar22;
        if (iVar13 == iVar7) {
          if (iVar13 != 0) {
            iVar6 = stbtt__close_shape(local_38,iVar6,iVar8,local_4c,(stbtt_int32)uVar9,
                                       (stbtt_int32)uVar19,(stbtt_int32)local_58,
                                       (stbtt_int32)local_68,cx,cy);
          }
          uVar9 = uVar12;
          uVar19 = uVar23;
          iVar7 = iVar13;
          if ((bVar18 & 1) == 0) {
            local_58 = (ushort *)uVar12;
            local_68 = uVar23;
            if ((local_38[lVar14 + 1].type & 1) == 0) {
              uVar9 = (ulong)(uint)((int)((int)local_38[lVar14 + 1].x + uVar5) >> 1);
              uVar19 = (ulong)(uint)((int)((int)local_38[lVar14 + 1].y + uVar22) >> 1);
            }
            else {
              uVar9 = (ulong)(uint)(int)local_38[lVar14 + 1].x;
              uVar19 = (ulong)(uint)(int)local_38[lVar14 + 1].y;
              iVar7 = iVar13 + 1;
            }
          }
          local_4c = bVar18 & 1 ^ 1;
          local_38[iVar6].type = '\x01';
          local_38[iVar6].x = (short)uVar9;
          local_38[iVar6].y = (short)uVar19;
          local_38[iVar6].cx = 0;
          local_38[iVar6].cy = 0;
          iVar13 = (ushort)(*(ushort *)((long)local_78 + (long)(int)local_70 * 2) << 8 |
                           *(ushort *)((long)local_78 + (long)(int)local_70 * 2) >> 8) + 1;
          local_70 = (ulong)((int)local_70 + 1);
          iVar8 = 0;
          iVar6 = iVar6 + 1;
        }
        else {
          sVar15 = (short)local_40;
          if ((bVar18 & 1) == 0) {
            local_40 = uVar23;
            if (iVar8 == 0) {
              iVar8 = 1;
              local_48 = uVar12;
            }
            else {
              local_38[iVar6].type = '\x03';
              local_38[iVar6].x = (short)(cx + uVar5 >> 1);
              local_38[iVar6].y = (short)(uVar22 + cy >> 1);
              local_38[iVar6].cx = (short)local_48;
              local_38[iVar6].cy = sVar15;
              iVar8 = 1;
              iVar6 = iVar6 + 1;
              local_48 = uVar12;
            }
          }
          else {
            psVar10 = local_38 + iVar6;
            if (iVar8 == 0) {
              psVar10->type = '\x02';
              psVar10->x = sVar21;
              psVar10->y = sVar2;
              psVar10->cx = 0;
              sVar15 = 0;
            }
            else {
              psVar10->type = '\x03';
              psVar10->x = sVar21;
              psVar10->y = sVar2;
              psVar10->cx = (short)local_48;
            }
            psVar10->cy = sVar15;
            iVar6 = iVar6 + 1;
            iVar8 = 0;
          }
        }
        iVar7 = iVar7 + 1;
      }
      iVar8 = stbtt__close_shape(local_38,iVar6,iVar8,local_4c,(stbtt_int32)uVar9,
                                 (stbtt_int32)uVar19,(stbtt_int32)local_58,(stbtt_int32)local_68,cx,
                                 cy);
      psVar10 = local_38;
    }
    *pvertices = psVar10;
  }
  return iVar8;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   stbtt_int16 numberOfContours;
   stbtt_uint8 *endPtsOfContours;
   stbtt_uint8 *data = info->data;
   stbtt_vertex *vertices=0;
   int num_vertices=0;
   int g = stbtt__GetGlyfOffset(info, glyph_index);

   *pvertices = NULL;

   if (g < 0) return 0;

   numberOfContours = ttSHORT(data + g);

   if (numberOfContours > 0) {
      stbtt_uint8 flags=0,flagcount;
      stbtt_int32 ins, i,j=0,m,n, next_move, was_off=0, off, start_off=0;
      stbtt_int32 x,y,cx,cy,sx,sy, scx,scy;
      stbtt_uint8 *points;
      endPtsOfContours = (data + g + 10);
      ins = ttUSHORT(data + g + 10 + numberOfContours * 2);
      points = data + g + 10 + numberOfContours * 2 + 2 + ins;

      n = 1+ttUSHORT(endPtsOfContours + numberOfContours*2-2);

      m = n + 2*numberOfContours;  // a loose bound on how many vertices we might need
      vertices = (stbtt_vertex *) STBTT_malloc(m * sizeof(vertices[0]), info->userdata);
      if (vertices == 0)
         return 0;

      next_move = 0;
      flagcount=0;

      // in first pass, we load uninterpreted data into the allocated array
      // above, shifted to the end of the array so we won't overwrite it when
      // we create our final data starting from the front

      off = m - n; // starting offset for uninterpreted data, regardless of how m ends up being calculated

      // first load flags

      for (i=0; i < n; ++i) {
         if (flagcount == 0) {
            flags = *points++;
            if (flags & 8)
               flagcount = *points++;
         } else
            --flagcount;
         vertices[off+i].type = flags;
      }

      // now load x coordinates
      x=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 2) {
            stbtt_int16 dx = *points++;
            x += (flags & 16) ? dx : -dx; // ???
         } else {
            if (!(flags & 16)) {
               x = x + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].x = (stbtt_int16) x;
      }

      // now load y coordinates
      y=0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         if (flags & 4) {
            stbtt_int16 dy = *points++;
            y += (flags & 32) ? dy : -dy; // ???
         } else {
            if (!(flags & 32)) {
               y = y + (stbtt_int16) (points[0]*256 + points[1]);
               points += 2;
            }
         }
         vertices[off+i].y = (stbtt_int16) y;
      }

      // now convert them to our format
      num_vertices=0;
      sx = sy = cx = cy = scx = scy = 0;
      for (i=0; i < n; ++i) {
         flags = vertices[off+i].type;
         x     = (stbtt_int16) vertices[off+i].x;
         y     = (stbtt_int16) vertices[off+i].y;

         if (next_move == i) {
            if (i != 0)
               num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);

            // now start the new one               
            start_off = !(flags & 1);
            if (start_off) {
               // if we start off with an off-curve point, then when we need to find a point on the curve
               // where we can start, and we need to save some state for when we wraparound.
               scx = x;
               scy = y;
               if (!(vertices[off+i+1].type & 1)) {
                  // next point is also a curve point, so interpolate an on-point curve
                  sx = (x + (stbtt_int32) vertices[off+i+1].x) >> 1;
                  sy = (y + (stbtt_int32) vertices[off+i+1].y) >> 1;
               } else {
                  // otherwise just use the next point as our start point
                  sx = (stbtt_int32) vertices[off+i+1].x;
                  sy = (stbtt_int32) vertices[off+i+1].y;
                  ++i; // we're using point i+1 as the starting point, so skip it
               }
            } else {
               sx = x;
               sy = y;
            }
            stbtt_setvertex(&vertices[num_vertices++], STBTT_vmove,sx,sy,0,0);
            was_off = 0;
            next_move = 1 + ttUSHORT(endPtsOfContours+j*2);
            ++j;
         } else {
            if (!(flags & 1)) { // if it's a curve
               if (was_off) // two off-curve control points in a row means interpolate an on-curve midpoint
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, (cx+x)>>1, (cy+y)>>1, cx, cy);
               cx = x;
               cy = y;
               was_off = 1;
            } else {
               if (was_off)
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vcurve, x,y, cx, cy);
               else
                  stbtt_setvertex(&vertices[num_vertices++], STBTT_vline, x,y,0,0);
               was_off = 0;
            }
         }
      }
      num_vertices = stbtt__close_shape(vertices, num_vertices, was_off, start_off, sx,sy,scx,scy,cx,cy);
   } else if (numberOfContours == -1) {
      // Compound shapes.
      int more = 1;
      stbtt_uint8 *comp = data + g + 10;
      num_vertices = 0;
      vertices = 0;
      while (more) {
         stbtt_uint16 flags, gidx;
         int comp_num_verts = 0, i;
         stbtt_vertex *comp_verts = 0, *tmp = 0;
         float mtx[6] = {1,0,0,1,0,0}, m, n;
         
         flags = ttSHORT(comp); comp+=2;
         gidx = ttSHORT(comp); comp+=2;

         if (flags & 2) { // XY values
            if (flags & 1) { // shorts
               mtx[4] = ttSHORT(comp); comp+=2;
               mtx[5] = ttSHORT(comp); comp+=2;
            } else {
               mtx[4] = ttCHAR(comp); comp+=1;
               mtx[5] = ttCHAR(comp); comp+=1;
            }
         }
         else {
            // @TODO handle matching point
            STBTT_assert(0);
         }
         if (flags & (1<<3)) { // WE_HAVE_A_SCALE
            mtx[0] = mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
         } else if (flags & (1<<6)) { // WE_HAVE_AN_X_AND_YSCALE
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = mtx[2] = 0;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         } else if (flags & (1<<7)) { // WE_HAVE_A_TWO_BY_TWO
            mtx[0] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[1] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[2] = ttSHORT(comp)/16384.0f; comp+=2;
            mtx[3] = ttSHORT(comp)/16384.0f; comp+=2;
         }
         
         // Find transformation scales.
         m = (float) STBTT_sqrt(mtx[0]*mtx[0] + mtx[1]*mtx[1]);
         n = (float) STBTT_sqrt(mtx[2]*mtx[2] + mtx[3]*mtx[3]);

         // Get indexed glyph.
         comp_num_verts = stbtt_GetGlyphShape(info, gidx, &comp_verts);
         if (comp_num_verts > 0) {
            // Transform vertices.
            for (i = 0; i < comp_num_verts; ++i) {
               stbtt_vertex* v = &comp_verts[i];
               stbtt_vertex_type x,y;
               x=v->x; y=v->y;
               v->x = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->y = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
               x=v->cx; y=v->cy;
               v->cx = (stbtt_vertex_type)(m * (mtx[0]*x + mtx[2]*y + mtx[4]));
               v->cy = (stbtt_vertex_type)(n * (mtx[1]*x + mtx[3]*y + mtx[5]));
            }
            // Append vertices.
            tmp = (stbtt_vertex*)STBTT_malloc((num_vertices+comp_num_verts)*sizeof(stbtt_vertex), info->userdata);
            if (!tmp) {
               if (vertices) STBTT_free(vertices, info->userdata);
               if (comp_verts) STBTT_free(comp_verts, info->userdata);
               return 0;
            }
            if (num_vertices > 0) STBTT_memcpy(tmp, vertices, num_vertices*sizeof(stbtt_vertex));
            STBTT_memcpy(tmp+num_vertices, comp_verts, comp_num_verts*sizeof(stbtt_vertex));
            if (vertices) STBTT_free(vertices, info->userdata);
            vertices = tmp;
            STBTT_free(comp_verts, info->userdata);
            num_vertices += comp_num_verts;
         }
         // More components ?
         more = flags & (1<<5);
      }
   } else if (numberOfContours < 0) {
      // @TODO other compound variations?
      STBTT_assert(0);
   } else {
      // numberOfCounters == 0, do nothing
   }

   *pvertices = vertices;
   return num_vertices;
}